

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O0

void write_cell_data(xlsxiowriter handle,char *rowattr,char *prefix,char *suffix,char *format,...)

{
  char in_AL;
  uint64_t col;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [40];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  char *local_70;
  char *p;
  column_info_struct *colinfo;
  char *data;
  char *pcStack_50;
  int datalen;
  char *cellcoord;
  va_list args;
  char *format_local;
  char *suffix_local;
  char *prefix_local;
  char *rowattr_local;
  xlsxiowriter handle_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  if (handle != (xlsxiowriter)0x0) {
    local_100 = in_R9;
    args[0].reg_save_area = format;
    if (handle->rowopen == 0) {
      write_row_start(handle,rowattr);
    }
    args[0].overflow_arg_area = local_128;
    args[0]._0_8_ = &stack0x00000008;
    cellcoord._4_4_ = 0x30;
    cellcoord._0_4_ = 0x28;
    if (((args[0].reg_save_area == (void *)0x0) ||
        (data._4_4_ = vsnprintf((char *)0x0,0,(char *)args[0].reg_save_area,&cellcoord),
        data._4_4_ < 0)) ||
       (colinfo = (column_info_struct *)malloc((long)(data._4_4_ + 1)),
       colinfo == (column_info_struct *)0x0)) {
      colinfo = (column_info_struct *)0x0;
      data._4_4_ = 0;
    }
    else {
      args[0].overflow_arg_area = local_128;
      args[0]._0_8_ = &stack0x00000008;
      cellcoord._4_4_ = 0x30;
      cellcoord._0_4_ = 0x28;
      vsnprintf((char *)colinfo,(long)(data._4_4_ + 1),(char *)args[0].reg_save_area,&cellcoord);
      fix_xml_special_chars((char **)&colinfo);
    }
    col = handle->colnr + 1;
    handle->colnr = col;
    pcStack_50 = get_A1col(col);
    if (handle->sheetopen == 0) {
      if (prefix != (char *)0x0) {
        append_data(&handle->buf,&handle->buflen,prefix,pcStack_50,handle->rownr);
      }
      if (colinfo != (column_info_struct *)0x0) {
        append_data(&handle->buf,&handle->buflen,"%s",colinfo);
      }
      if (suffix != (char *)0x0) {
        append_data(&handle->buf,&handle->buflen,suffix);
      }
      if (handle->sheetopen == 0) {
        if ((*handle->pcurrentcolumn == (column_info_struct *)0x0) &&
           (p = (char *)malloc(0x10), (column_info_struct *)p != (column_info_struct *)0x0)) {
          ((column_info_struct *)p)->width = 0;
          ((column_info_struct *)p)->maxwidth = 0;
          ((column_info_struct *)p)->next = (column_info_struct *)0x0;
          *handle->pcurrentcolumn = (column_info_struct *)p;
        }
        if (colinfo != (column_info_struct *)0x0) {
          local_70 = strchr((char *)colinfo,10);
          if (local_70 != (char *)0x0) {
            data._4_4_ = (int)local_70 - (int)colinfo;
          }
          if ((0 < data._4_4_) && ((*handle->pcurrentcolumn)->maxwidth < data._4_4_)) {
            (*handle->pcurrentcolumn)->maxwidth = data._4_4_;
          }
        }
        handle->pcurrentcolumn = &(*handle->pcurrentcolumn)->next;
      }
    }
    else {
      if (prefix != (char *)0x0) {
        fprintf((FILE *)handle->pipe_write,prefix,pcStack_50,handle->rownr);
      }
      if (colinfo != (column_info_struct *)0x0) {
        fprintf((FILE *)handle->pipe_write,"%s",colinfo);
      }
      if (suffix != (char *)0x0) {
        fprintf((FILE *)handle->pipe_write,"%s",suffix);
      }
    }
    free(pcStack_50);
    free(colinfo);
  }
  return;
}

Assistant:

void write_cell_data (xlsxiowriter handle, const char* rowattr, const char* prefix, const char* suffix, const char* format, ...)
{
  va_list args;
#if !defined(NO_ROW_NUMBERS) && !defined(NO_COLUMN_NUMBERS)
  char* cellcoord;
#endif
  if (!handle)
    return;
  //start new row if needed
  if (!handle->rowopen)
    write_row_start(handle, rowattr);
  //get formatted data
  int datalen;
  char* data;
  va_start(args, format);
  if (format && (datalen = vsnprintf(NULL, 0, format, args)) >= 0 && (data = (char*)malloc(datalen + 1)) != NULL) {
    va_end(args);
    va_start(args, format);
    vsnprintf(data, datalen + 1, format, args);
    //prepare data for XML output
    fix_xml_special_chars(&data);
  } else {
    data = NULL;
    datalen = 0;
  }
  va_end(args);
  //determine cell coordinate
#if !defined(NO_ROW_NUMBERS) && !defined(NO_COLUMN_NUMBERS)
  cellcoord = get_A1col(++handle->colnr);
#define COLNRPARAM(handle) , cellcoord, handle->rownr
#else
#define COLNRPARAM(handle)
#endif
  //add cell data
  if (handle->sheetopen) {
    //write cell data
    if (prefix)
      fprintf(handle->pipe_write, prefix COLNRPARAM(handle));
    if (data)
      fprintf(handle->pipe_write, "%s", data);
    if (suffix)
      fprintf(handle->pipe_write, "%s", suffix);
  } else {
    //add cell data to buffer
    if (prefix)
      append_data(&handle->buf, &handle->buflen, prefix COLNRPARAM(handle));
    if (data)
      append_data(&handle->buf, &handle->buflen, "%s", data);
    if (suffix)
      append_data(&handle->buf, &handle->buflen, suffix);
    //collect cell information
    if (!handle->sheetopen) {
      if (!*handle->pcurrentcolumn) {
        //create new column information structure
        struct column_info_struct* colinfo;
        if ((colinfo = (struct column_info_struct*)malloc(sizeof(struct column_info_struct))) != NULL) {
          colinfo->width = 0;
          colinfo->maxwidth = 0;
          colinfo->next = NULL;
          *handle->pcurrentcolumn = colinfo;
        }
      }
      //keep track of biggest column width
      if (data) {
        //only count first line in multiline data
        char* p = strchr(data, '\n');
        if (p)
          datalen = p - data;
        //remember this length if it is the longest one so far
        if (datalen > 0 && datalen > (*handle->pcurrentcolumn)->maxwidth)
          (*handle->pcurrentcolumn)->maxwidth = datalen;
      }
      //prepare for the next column
      handle->pcurrentcolumn = &(*handle->pcurrentcolumn)->next;
    }
  }
#if !defined(NO_ROW_NUMBERS) && !defined(NO_COLUMN_NUMBERS)
  free(cellcoord);
#endif
  free(data);
}